

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

pair<sjtu::map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>::iterator,_bool>
* __thiscall
sjtu::map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
::insert(map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
         *this,value_type *value)

{
  Node *pNVar1;
  Node *this_00;
  iterator *__x;
  undefined8 *in_RDX;
  map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
  *in_RSI;
  Node *in_RDI;
  Node *node;
  bool *in_stack_ffffffffffffff60;
  iterator *in_stack_ffffffffffffff68;
  map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
  *local_70;
  iterator local_68;
  undefined1 local_51;
  map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
  *local_50;
  iterator local_48;
  color_type local_38 [4];
  iterator *local_28;
  Node *local_20;
  undefined8 *local_18;
  
  local_18 = in_RDX;
  local_20 = search(in_RSI,(long *)in_RDI);
  if (local_20 == in_RSI->nil) {
    this_00 = (Node *)operator_new(0x28);
    __x = (iterator *)operator_new(0x10);
    pNVar1 = (Node *)local_18[1];
    __x->cor = (map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
                *)*local_18;
    __x->ptr = pNVar1;
    local_38[0] = RED;
    local_28 = __x;
    Node::Node(this_00,(value_type **)&local_28,local_38);
    local_20 = this_00;
    insert(in_RSI,in_RDI);
    iterator::iterator(&local_48,&local_50,&local_20);
    local_51 = 1;
    std::
    make_pair<sjtu::map<long,sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode*,std::less<long>>::iterator,bool>
              (__x,(bool *)this_00);
  }
  else {
    iterator::iterator(&local_68,&local_70,&local_20);
    std::
    make_pair<sjtu::map<long,sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode*,std::less<long>>::iterator,bool>
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  }
  return (pair<sjtu::map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>::iterator,_bool>
          *)in_RDI;
}

Assistant:

std::pair<iterator , bool> insert(const value_type &value)
	{
		Node *node = search(value.first);
		if (node == nil)
		{
			node = new Node (new value_type (value) , RED) , insert(node);
			return std::make_pair(iterator(this , node) , true);
		}
		else return std::make_pair(iterator(this , node) , false);
	}